

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void I422ToAR30Row_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  
  if (1 < width) {
    sVar1 = yuvconstants->kUVBiasB[0];
    sVar2 = yuvconstants->kUVBiasG[0];
    sVar3 = yuvconstants->kUVBiasR[0];
    iVar6 = yuvconstants->kYToRgb[0] * 0x101;
    lVar9 = 0;
    do {
      uVar7 = (uint)src_y[lVar9] * iVar6 >> 0x10;
      iVar4 = (uVar7 - (int)yuvconstants->kUVToB[0] * (uint)*src_u) + (int)sVar1;
      if (iVar4 >> 4 < 1) {
        iVar4 = 0;
      }
      uVar5 = iVar4 >> 4;
      if (0x3fe < (int)uVar5) {
        uVar5 = 0x3ff;
      }
      iVar4 = ((int)sVar2 + uVar7) -
              ((int)yuvconstants->kUVToG[1] * (uint)*src_v +
              (int)yuvconstants->kUVToG[0] * (uint)*src_u);
      if (iVar4 >> 4 < 1) {
        iVar4 = 0;
      }
      iVar4 = iVar4 >> 4;
      if (0x3fe < iVar4) {
        iVar4 = 0x3ff;
      }
      iVar8 = (uVar7 - (int)yuvconstants->kUVToR[1] * (uint)*src_v) + (int)sVar3;
      if (iVar8 >> 4 < 1) {
        iVar8 = 0;
      }
      iVar8 = iVar8 >> 4;
      if (0x3fe < iVar8) {
        iVar8 = 0x3ff;
      }
      *(uint *)rgb_buf = iVar8 << 0x14 | 0xc0000000U | iVar4 << 10 | uVar5;
      uVar7 = (uint)src_y[lVar9 + 1] * iVar6 >> 0x10;
      iVar4 = ((int)sVar1 + uVar7) - (int)yuvconstants->kUVToB[0] * (uint)*src_u;
      if (iVar4 >> 4 < 1) {
        iVar4 = 0;
      }
      uVar5 = iVar4 >> 4;
      if (0x3fe < (int)uVar5) {
        uVar5 = 0x3ff;
      }
      iVar4 = ((int)sVar2 + uVar7) -
              ((int)yuvconstants->kUVToG[1] * (uint)*src_v +
              (int)yuvconstants->kUVToG[0] * (uint)*src_u);
      if (iVar4 >> 4 < 1) {
        iVar4 = 0;
      }
      iVar4 = iVar4 >> 4;
      if (0x3fe < iVar4) {
        iVar4 = 0x3ff;
      }
      iVar8 = (uVar7 + (int)sVar3) - (int)yuvconstants->kUVToR[1] * (uint)*src_v;
      if (iVar8 >> 4 < 1) {
        iVar8 = 0;
      }
      iVar8 = iVar8 >> 4;
      if (0x3fe < iVar8) {
        iVar8 = 0x3ff;
      }
      *(uint *)((long)rgb_buf + 4) = iVar8 << 0x14 | 0xc0000000U | iVar4 << 10 | uVar5;
      src_u = src_u + 1;
      src_v = src_v + 1;
      rgb_buf = (uint8_t *)((long)rgb_buf + 8);
      lVar9 = lVar9 + 2;
    } while ((int)lVar9 < width + -1);
    src_y = src_y + lVar9;
  }
  if ((width & 1U) != 0) {
    uVar5 = (int)yuvconstants->kYToRgb[0] * (uint)*src_y * 0x101 >> 0x10;
    uVar7 = (int)(((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)*src_u) +
                 uVar5) >> 4;
    iVar6 = (int)(((int)yuvconstants->kUVBiasG[0] -
                  ((int)yuvconstants->kUVToG[1] * (uint)*src_v +
                  (int)yuvconstants->kUVToG[0] * (uint)*src_u)) + uVar5) >> 4;
    iVar4 = (int)(((int)yuvconstants->kUVBiasR[0] - (int)yuvconstants->kUVToR[1] * (uint)*src_v) +
                 uVar5) >> 4;
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    if (0x3fe < (int)uVar7) {
      uVar7 = 0x3ff;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0x3fe < iVar6) {
      iVar6 = 0x3ff;
    }
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    if (0x3fe < iVar4) {
      iVar4 = 0x3ff;
    }
    *(uint *)rgb_buf = (iVar6 << 10 | uVar7) + iVar4 * 0x100000 + 0xc0000000;
  }
  return;
}

Assistant:

void I422ToAR30Row_C(const uint8_t* src_y,
                     const uint8_t* src_u,
                     const uint8_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  int b;
  int g;
  int r;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel8_16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
    YuvPixel8_16(src_y[1], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf + 4, b, g, r);
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel8_16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
  }
}